

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::anon_unknown_0::IoTest_FileIo_Test::TestBody(IoTest_FileIo_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AlphaNum *in_RCX;
  AssertHelper local_220;
  Message local_218;
  int local_210 [2];
  undefined1 local_208 [8];
  AssertionResult gtest_ar_3;
  FileInputStream input;
  Message local_198;
  long local_190;
  __off_t local_188;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_2;
  Message local_168;
  int local_160 [2];
  undefined1 local_158 [8];
  AssertionResult gtest_ar_1;
  FileOutputStream output;
  AssertHelper local_f8;
  Message local_f0;
  int local_e4;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar;
  int local_c8;
  int file;
  int j;
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  AlphaNum local_60;
  undefined1 local_30 [8];
  string filename;
  IoTest_FileIo_Test *this_local;
  
  filename.field_2._8_8_ = this;
  testing::TempDir_abi_cxx11_();
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_60,&local_80);
  absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)&j,"/zero_copy_stream_test_file");
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)local_30,(lts_20250127 *)&local_60,(AlphaNum *)&j,in_RCX);
  std::__cxx11::string::~string((string *)&local_80);
  for (file = 0; file < 8; file = file + 1) {
    for (local_c8 = 0; local_c8 < 8; local_c8 = local_c8 + 1) {
      pcVar2 = (char *)std::__cxx11::string::c_str();
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = open(pcVar2,0x242,0x1ff);
      local_e4 = 0;
      testing::internal::CmpHelperGE<int,int>
                ((internal *)local_e0,"file","0",
                 (int *)((long)&gtest_ar.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        + 4),&local_e4);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
      if (!bVar1) {
        testing::Message::Message(&local_f0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
        testing::internal::AssertHelper::AssertHelper
                  (&local_f8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
                   ,0x586,pcVar2);
        testing::internal::AssertHelper::operator=(&local_f8,&local_f0);
        testing::internal::AssertHelper::~AssertHelper(&local_f8);
        testing::Message::~Message(&local_f0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
      if (!bVar1) goto LAB_0111680b;
      FileOutputStream::FileOutputStream
                ((FileOutputStream *)&gtest_ar_1.message_,
                 gtest_ar.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._4_4_,
                 *(int *)(io::(anonymous_namespace)::IoTest::kBlockSizes + (long)file * 4));
      IoTest::WriteStuff(&this->super_IoTest,(ZeroCopyOutputStream *)&gtest_ar_1.message_);
      local_160[1] = 0;
      local_160[0] = FileOutputStream::GetErrno((FileOutputStream *)&gtest_ar_1.message_);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_158,"0","output.GetErrno()",local_160 + 1,local_160);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
      if (!bVar1) {
        testing::Message::Message(&local_168);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
                   ,0x58b,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_168);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_168);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
      FileOutputStream::~FileOutputStream((FileOutputStream *)&gtest_ar_1.message_);
      local_188 = lseek(gtest_ar.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_4_,0,0);
      local_190 = -1;
      testing::internal::CmpHelperNE<long,long>
                ((internal *)local_180,"lseek(file, 0, 0)","(off_t)-1",&local_188,&local_190);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
      if (!bVar1) {
        testing::Message::Message(&local_198);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&input.impl_.backup_bytes_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
                   ,0x58f,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&input.impl_.backup_bytes_,&local_198);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&input.impl_.backup_bytes_);
        testing::Message::~Message(&local_198);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
      if (!bVar1) goto LAB_0111680b;
      FileInputStream::FileInputStream
                ((FileInputStream *)&gtest_ar_3.message_,
                 gtest_ar.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl._4_4_,
                 *(int *)(io::(anonymous_namespace)::IoTest::kBlockSizes + (long)local_c8 * 4));
      IoTest::ReadStuff(&this->super_IoTest,(ZeroCopyInputStream *)&gtest_ar_3.message_,true);
      local_210[1] = 0;
      local_210[0] = FileInputStream::GetErrno((FileInputStream *)&gtest_ar_3.message_);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_208,"0","input.GetErrno()",local_210 + 1,local_210);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
      if (!bVar1) {
        testing::Message::Message(&local_218);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
        testing::internal::AssertHelper::AssertHelper
                  (&local_220,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
                   ,0x594,pcVar2);
        testing::internal::AssertHelper::operator=(&local_220,&local_218);
        testing::internal::AssertHelper::~AssertHelper(&local_220);
        testing::Message::~Message(&local_218);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
      FileInputStream::~FileInputStream((FileInputStream *)&gtest_ar_3.message_);
      close(gtest_ar.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_);
    }
  }
LAB_0111680b:
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST_F(IoTest, FileIo) {
  std::string filename =
      absl::StrCat(::testing::TempDir(), "/zero_copy_stream_test_file");

  for (int i = 0; i < kBlockSizeCount; i++) {
    for (int j = 0; j < kBlockSizeCount; j++) {
      // Make a temporary file.
      int file =
          open(filename.c_str(), O_RDWR | O_CREAT | O_TRUNC | O_BINARY, 0777);
      ASSERT_GE(file, 0);

      {
        FileOutputStream output(file, kBlockSizes[i]);
        WriteStuff(&output);
        EXPECT_EQ(0, output.GetErrno());
      }

      // Rewind.
      ASSERT_NE(lseek(file, 0, SEEK_SET), (off_t)-1);

      {
        FileInputStream input(file, kBlockSizes[j]);
        ReadStuff(&input);
        EXPECT_EQ(0, input.GetErrno());
      }

      close(file);
    }
  }
}